

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlNodePtrWrap(xmlNodePtr node)

{
  PyObject *ret;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    node_local = (xmlNodePtr)&_Py_NoneStruct;
  }
  else {
    node_local = (xmlNodePtr)PyCapsule_New(node,"xmlNodePtr",0);
  }
  return (PyObject *)node_local;
}

Assistant:

PyObject *
libxml_xmlNodePtrWrap(xmlNodePtr node)
{
    PyObject *ret;

    if (node == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) node, (char *) "xmlNodePtr", NULL);
    return (ret);
}